

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::isWord(Lexer *this,string *token,Type *type)

{
  bool bVar1;
  char *pcVar2;
  byte local_5a;
  byte local_59;
  string local_50 [32];
  size_t local_30;
  size_t marker;
  Type *type_local;
  string *token_local;
  Lexer *this_local;
  
  if ((this->_enableWord & 1U) != 0) {
    local_30 = this->_cursor;
    marker = (size_t)type;
    type_local = (Type *)token;
    token_local = &this->_text;
    while( true ) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      local_59 = 0;
      if (*pcVar2 != '\0') {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
        bVar1 = unicodeWhitespace((int)*pcVar2);
        local_59 = 0;
        if (!bVar1) {
          local_5a = 1;
          if ((this->_enableOperator & 1U) != 0) {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
            bVar1 = isSingleCharOperator((int)*pcVar2);
            local_5a = bVar1 ^ 0xff;
          }
          local_59 = local_5a;
        }
      }
      if ((local_59 & 1) == 0) break;
      utf8_next_char(&this->_text,&local_30);
    }
    if (this->_cursor < local_30) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)type_local,local_50);
      std::__cxx11::string::~string(local_50);
      *(undefined4 *)marker = 8;
      this->_cursor = local_30;
      return true;
    }
  }
  return false;
}

Assistant:

bool Lexer::isWord (std::string& token, Lexer::Type& type)
{
  if (_enableWord)
  {
    std::size_t marker = _cursor;

    while (_text[marker] &&
           ! unicodeWhitespace (_text[marker]) &&
           (! _enableOperator || ! isSingleCharOperator (_text[marker])))
      utf8_next_char (_text, marker);

    if (marker > _cursor)
    {
      token = _text.substr (_cursor, marker - _cursor);
      type = Lexer::Type::word;
      _cursor = marker;
      return true;
    }
  }

  return false;
}